

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_dynamic_suite::dynamic_first_unused_segment_const(void)

{
  const_segment cVar1;
  initializer_list<int> __l;
  allocator_type local_79;
  vector<int,_std::allocator<int>_> expect;
  int local_60 [2];
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array._M_elems;
  array._M_elems[0] = 0xb;
  array._M_elems[1] = 0x16;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.cap = 4;
  span.member.size = 2;
  span.member.next = 2;
  cVar1 = vista::circular_view<int,_18446744073709551615UL>::first_unused_segment(&span);
  local_60[0] = 0;
  local_60[1] = 0;
  __l._M_len = 2;
  __l._M_array = local_60;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_79);
  boost::detail::
  test_all_eq_impl<std::ostream,int_const*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x23c,"void api_dynamic_suite::dynamic_first_unused_segment_const()",cVar1.member.head
             ,cVar1.member.tail,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void dynamic_first_unused_segment_const()
{
    std::array<int, 4> array = { 11, 22 };
    const circular_view<int> span(array.begin(), array.end(), array.begin(), 2);
    auto segment = span.first_unused_segment();
    {
        std::vector<int> expect = { 0, 0 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}